

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O2

int fy_fetch_plain_scalar(fy_parser *fyp,int c)

{
  fy_input *fyi;
  undefined8 uVar1;
  uint3 uVar2;
  bool bVar3;
  _Bool _Var4;
  int iVar5;
  uint uVar6;
  int iVar7;
  fy_atom *pfVar8;
  void *pvVar9;
  long lVar10;
  undefined7 extraout_var;
  fy_token *fyt;
  uint uVar11;
  char *pcVar12;
  char *pcVar13;
  size_t sVar14;
  ulong uVar15;
  ulong uStack_150;
  undefined1 local_148 [48];
  char *apcStack_118 [2];
  undefined1 local_108 [8];
  fy_simple_key_mark skm;
  fy_mark local_c8;
  undefined8 local_b0;
  undefined8 local_a8;
  ulong local_a0;
  void *local_98;
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  size_t local_70;
  uint local_5c;
  ulong local_58;
  int local_50;
  int local_4c;
  size_t local_48;
  ulong local_40;
  byte local_31;
  
  pcVar12 = local_108;
  apcStack_118[1] = (char *)0xffffffffffffffff;
  if ((c == 9) && (fyp->state == FYPS_BLOCK_MAPPING_VALUE)) {
    local_70 = 0;
    local_80._0_8_ = 0;
    local_80._8_8_ = (char *)0x0;
    local_90._0_8_ = 0x200000004;
    pfVar8 = fy_fill_atom_at(fyp,0,1,(fy_atom *)local_148);
    local_90._8_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar8);
    pcVar12 = "invalid tab as indendation in a mapping";
LAB_0012fc86:
    fy_parser_diag_report(fyp,(fy_diag_report_ctx *)local_90,pcVar12);
    return -1;
  }
  apcStack_118[1] = (char *)0x12fc34;
  _Var4 = fyp_is_blankz(fyp,c);
  if (_Var4) {
    local_70 = 0;
    local_80._0_8_ = 0;
    local_80._8_8_ = (char *)0x0;
    local_90._0_8_ = 0x200000004;
    pfVar8 = fy_fill_atom_at(fyp,0,1,(fy_atom *)local_148);
    local_90._8_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar8);
    pcVar12 = "plain scalar cannot start with blank or zero";
    goto LAB_0012fc86;
  }
  sVar14 = (size_t)(uint)c;
  apcStack_118[1] = (char *)0x12fca4;
  pvVar9 = fy_utf8_strchr(",[]{}#&*!|>\'\"%@`",c);
  if (pvVar9 != (void *)0x0) {
    local_70 = 0;
    local_80._0_8_ = 0;
    local_80._8_8_ = (char *)0x0;
    local_90._0_8_ = 0x200000004;
    pfVar8 = fy_fill_atom_at(fyp,0,1,(fy_atom *)local_148);
    local_90._8_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar8);
    pcVar12 = "plain scalar cannot start with \'%c\'";
LAB_0012fcfb:
    uStack_150 = (ulong)(uint)c;
LAB_0012fd04:
    fy_parser_diag_report(fyp,(fy_diag_report_ctx *)local_90,pcVar12,uStack_150);
    return -1;
  }
  if (c == 0x2d) {
    apcStack_118[1] = (char *)0x12fd2b;
    _Var4 = fy_is_blank_at_offset(fyp,sVar14);
    if (_Var4) {
      local_70 = 0;
      local_80._0_8_ = 0;
      local_80._8_8_ = (char *)0x0;
      local_90._0_8_ = 0x200000004;
      pfVar8 = fy_fill_atom_at(fyp,0,2,(fy_atom *)local_148);
      local_90._8_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar8);
      pcVar12 = "plain scalar cannot start with \'%c\' followed by blank";
      uStack_150 = 0x2d;
      goto LAB_0012fd04;
    }
  }
  if (fyp->flow_level == 0) {
    if ((c == 0x3f) || (c == 0x3a)) {
      apcStack_118[1] = (char *)0x12fe31;
      _Var4 = fy_is_blank_at_offset(fyp,sVar14);
      if (_Var4) {
        local_70 = 0;
        local_80._0_8_ = 0;
        local_80._8_8_ = (char *)0x0;
        local_90._0_8_ = 0x200000004;
        pfVar8 = fy_fill_atom_at(fyp,0,2,(fy_atom *)local_148);
        local_90._8_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar8);
        pcVar12 = "plain scalar cannot start with \'%c\' followed by blank (in block context)";
        goto LAB_0012fcfb;
      }
      if (fyp->flow_level != 0) goto LAB_0012fd95;
    }
  }
  else {
LAB_0012fd95:
    if (fyp->column <= fyp->indent) {
      local_70 = 0;
      local_80._0_8_ = 0;
      local_80._8_8_ = (char *)0x0;
      local_90._0_8_ = 0x200000004;
      pfVar8 = fy_fill_atom_at(fyp,0,1,(fy_atom *)local_148);
      local_90._8_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar8);
      pcVar12 = "mapping";
      if (fyp->flow == FYFT_SEQUENCE) {
        pcVar12 = "sequence";
      }
      fy_parser_diag_report(fyp,(fy_diag_report_ctx *)local_90,"wrongly indented flow %s",pcVar12);
      return -1;
    }
  }
  apcStack_118[1] = (char *)0x12fea5;
  fy_get_simple_key_mark(fyp,(fy_simple_key_mark *)local_108);
  apcStack_118[1] = (char *)0x12feb4;
  fy_fill_atom_start(fyp,(fy_atom *)local_90);
  local_50 = fyp->indent;
  local_c8.input_pos = 0;
  local_c8.line = 0;
  local_c8.column = 0;
  uVar6 = 0xffffffff;
  local_98 = (void *)0x0;
  local_a0 = 0;
  bVar3 = false;
  local_a8 = 0;
  local_b0 = 0;
  iVar7 = 0;
  uVar15 = 0;
  local_40 = 0;
  local_48 = 0;
  do {
    if (fyp->column == 0) {
      apcStack_118[1] = (char *)0x12ff28;
      iVar5 = fy_parse_strncmp(fyp,"---",3);
      if (iVar5 != 0) {
        apcStack_118[1] = (char *)0x12ff3e;
        iVar5 = fy_parse_strncmp(fyp,"...",3);
        if (iVar5 != 0) goto LAB_0012ff55;
      }
      apcStack_118[1] = (char *)0x12ff4d;
      _Var4 = fy_is_blankz_at_offset(fyp,3);
      if (_Var4) break;
    }
LAB_0012ff55:
    apcStack_118[1] = (char *)0x12ff61;
    local_58 = uVar15;
    uVar6 = fy_parse_peek(fyp);
    if (uVar6 == 0x23) {
      uVar6 = 0x23;
      uVar15 = local_58;
      break;
    }
    local_4c = 0;
    uVar15 = local_40;
    while( true ) {
      apcStack_118[1] = (char *)0x12ff83;
      _Var4 = fyp_is_blankz(fyp,uVar6);
      if (_Var4) break;
      apcStack_118[1] = (char *)0x12ff96;
      iVar5 = fy_parse_peek_at(fyp,1);
      local_40 = CONCAT44(local_40._4_4_,iVar5);
      if (uVar6 == 0x3a) {
        apcStack_118[1] = (char *)0x12ffaa;
        _Var4 = fyp_is_blankz(fyp,iVar5);
        if (_Var4) break;
        if (fyp->flow_level != 0) {
          apcStack_118[1] = (char *)0x12ffc7;
          pvVar9 = fy_utf8_strchr(",[]{}",(uint)local_40);
          if (pvVar9 == (void *)0x0) goto LAB_0012ffd0;
          break;
        }
      }
      else {
LAB_0012ffd0:
        if ((fyp->flow_level != 0) &&
           (((uVar6 - 0x5b < 0x23 && ((0x500000005U >> ((ulong)(uVar6 - 0x5b) & 0x3f) & 1) != 0)) ||
            (uVar6 == 0x2c)))) break;
      }
      iVar5 = (int)uVar15;
      if (iVar5 == 0) {
        if (iVar7 != 0) goto LAB_0013001d;
      }
      else {
        iVar7 = iVar5 + -1;
        if (iVar5 < 2) {
          iVar7 = 1;
        }
LAB_0013001d:
        local_48 = local_48 + (long)iVar7;
      }
      local_31 = uVar6 - 0x110001 < 0xffef001f;
      apcStack_118[1] = (char *)0x13004d;
      fy_advance(fyp,uVar6);
      lVar10 = 1;
      if ((0x7f < (int)uVar6) && (lVar10 = 2, 0x7ff < uVar6)) {
        lVar10 = 4 - (ulong)(uVar6 < 0x10000);
      }
      local_48 = local_48 + lVar10;
      local_58 = CONCAT71((int7)(local_58 >> 8),
                          (byte)local_58 | (uVar6 == 0x22 || uVar6 == 0x5c) | local_31);
      local_4c = local_4c + -1;
      iVar7 = 0;
      uVar15 = 0;
      uVar6 = (uint)local_40;
    }
    if (local_4c != 0) {
      local_c8.input_pos = fyp->current_input_pos;
      local_98 = fyp->current_ptr;
      local_c8.line = fyp->line;
      local_c8.column = fyp->column;
    }
    if ((uVar6 != 9) && (uVar6 != 0x20)) {
      apcStack_118[1] = (char *)0x1300db;
      _Var4 = fyp_is_lb(fyp,uVar6);
      uVar15 = local_58;
      if (!_Var4) break;
    }
    iVar7 = 0;
    local_40 = 0;
    uVar11 = uVar6;
    do {
      do {
        apcStack_118[1] = (char *)0x1300f9;
        fy_advance(fyp,uVar11);
        if (((uVar11 == 9) && (fyp->tabsize == 0)) && ((bVar3 && (fyp->column <= local_50)))) {
          skm.required = true;
          skm._17_3_ = 0;
          skm.flow_level = 2;
          pfVar8 = fy_fill_atom_at(fyp,0,1,(fy_atom *)local_148);
          fy_token_create(FYTT_INPUT_MARKER,pfVar8);
          pcVar13 = "invalid tab used as indentation";
          goto LAB_00130211;
        }
        apcStack_118[1] = (char *)0x13011f;
        uVar6 = fy_parse_peek(fyp);
        apcStack_118[1] = (char *)0x13012d;
        _Var4 = fyp_is_lb(fyp,uVar11);
        if (_Var4) {
          if (!bVar3) {
            bVar3 = true;
          }
          uVar11 = (int)local_40 + 1;
          local_40 = (ulong)uVar11;
          iVar7 = 0;
          local_a0 = CONCAT71((uint7)(uint3)(uVar11 >> 8),1);
          local_a8 = 1;
        }
        else {
          iVar7 = iVar7 + 1;
          local_b0 = CONCAT71(extraout_var,1);
        }
        uVar11 = uVar6;
      } while ((uVar6 == 9) || (uVar6 == 0x20));
      apcStack_118[1] = (char *)0x130194;
      _Var4 = fyp_is_lb(fyp,uVar6);
    } while (_Var4);
    uVar2 = (uint3)(uVar6 >> 8);
    uVar15 = CONCAT71((uint7)uVar2,1);
  } while ((fyp->flow_level != 0) || (uVar15 = (ulong)CONCAT31(uVar2,1), local_50 < fyp->column));
  if (local_98 == (void *)0x0) {
    apcStack_118[1] = (char *)0x13025f;
    fy_fill_atom_end(fyp,(fy_atom *)local_90);
  }
  else {
    apcStack_118[1] = (char *)0x13024e;
    fy_fill_atom_end_at(fyp,(fy_atom *)local_90,&local_c8);
  }
  sVar14 = local_48;
  if (uVar6 + 3 < 2) {
    skm.required = true;
    skm._17_3_ = 0;
    skm.flow_level = 2;
    pfVar8 = fy_fill_atom_mark(fyp->current_input,(fy_mark *)local_90,(fy_mark *)local_80,
                               (fy_atom *)local_148);
    fy_token_create(FYTT_INPUT_MARKER,pfVar8);
    pcVar13 = "plain scalar is malformed UTF8";
LAB_00130211:
    pcVar12 = local_148;
    fy_parser_diag_report(fyp,(fy_diag_report_ctx *)&skm.required,pcVar13);
  }
  else {
    uVar6 = 0;
    if ((int)local_80._8_4_ <= (int)local_90._8_4_ && (uVar15 & 1) == 0) {
      uVar6 = (uint)(local_80._0_8_ - local_90._0_8_ == local_48) << 10;
    }
    local_40 = CONCAT44(local_40._4_4_,fyp->pending_complex_key_column);
    local_5c = (fyp->tabsize & 0xfU) << 0x16 |
               (uint)(local_48 == 0) << 0x14 |
               (uint)((byte)local_b0 & 1) << 0xe |
               (uint)((byte)local_a8 & 1) << 0xd | local_5c & 0xfc000800 | uVar6;
    apcStack_118[1] = (char *)0x130352;
    iVar7 = fy_atom_format_text_length((fy_atom *)local_90);
    if (sVar14 != (long)iVar7) {
      apcStack_118[1] = (char *)0x1303fc;
      local_48 = sVar14;
      pcVar13 = fy_atom_data((fy_atom *)local_90);
      apcStack_118[1] = (char *)0x130418;
      iVar5 = fy_utf8_format_text_length(pcVar13,local_80._0_8_ - local_90._0_8_,fyue_singlequote);
      lVar10 = -((long)iVar5 + 0x10U & 0xfffffffffffffff0);
      pcVar12 = local_108 + lVar10;
      *(undefined8 *)(local_108 + lVar10 + -8) = 0x13043a;
      pcVar13 = fy_utf8_format_text(pcVar13,local_80._0_8_ - local_90._0_8_,pcVar12,(long)iVar5,
                                    fyue_singlequote);
      *(undefined8 *)(local_148 + lVar10 + 0x30) = 4;
      uVar1 = *(undefined8 *)(local_148 + lVar10 + 0x30);
      *(char **)(local_148 + lVar10 + 0x30) = pcVar13;
      *(size_t *)(local_148 + lVar10 + 0x28) = local_48;
      *(long *)(local_148 + lVar10 + 0x20) = (long)iVar7;
      *(undefined8 *)(local_148 + lVar10 + 0x18) = 0x13046f;
      fy_parser_diag(fyp,(uint)uVar1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                     ,0xd68,"fy_fetch_plain_scalar",
                     "storage hint calculation failed real %zu != hint %zu - \'%s\'");
      goto LAB_00130218;
    }
    local_70 = sVar14;
    local_5c = local_5c | 0x800;
    fyi = fyp->current_input;
    if ((fyi != (fy_input *)0x0) && ((fyi->field_0x74 & 1) != 0)) {
      if ((int)local_90._8_4_ < (int)local_80._8_4_) {
        skm.required = true;
        skm._17_3_ = 0;
        skm.flow_level = 2;
        pfVar8 = fy_fill_atom_mark(fyi,(fy_mark *)local_90,(fy_mark *)local_80,(fy_atom *)local_148)
        ;
        fy_token_create(FYTT_INPUT_MARKER,pfVar8);
        pcVar13 = "Multi line plain scalars not supported in JSON mode";
        goto LAB_00130211;
      }
      apcStack_118[1] = (char *)0x13048b;
      iVar7 = fy_atom_strcmp((fy_atom *)local_90,"false");
      if (iVar7 != 0) {
        apcStack_118[1] = (char *)0x1304a2;
        iVar7 = fy_atom_strcmp((fy_atom *)local_90,"true");
        if (iVar7 != 0) {
          apcStack_118[1] = (char *)0x1304b9;
          iVar7 = fy_atom_strcmp((fy_atom *)local_90,"null");
          if (iVar7 != 0) {
            apcStack_118[1] = (char *)0x1304c9;
            _Var4 = fy_atom_is_number((fy_atom *)local_90);
            if (!_Var4) {
              skm.required = true;
              skm._17_3_ = 0;
              skm.flow_level = 2;
              pfVar8 = fy_fill_atom_mark(fyp->current_input,(fy_mark *)local_90,(fy_mark *)local_80,
                                         (fy_atom *)local_148);
              fy_token_create(FYTT_INPUT_MARKER,pfVar8);
              pcVar13 = "Invalid JSON plain scalar";
              goto LAB_00130211;
            }
          }
        }
      }
    }
    apcStack_118[1] = (char *)0x1304e7;
    fyt = fy_token_queue(fyp,FYTT_SCALAR,local_90,0);
    if (fyt == (fy_token *)0x0) {
      pcVar13 = "fy_token_queue() failed";
      iVar7 = 0xd7f;
    }
    else {
      if ((((int)local_90._8_4_ < (int)local_80._8_4_) && (fyp->flow_level == 0)) &&
         ((int)(uint)local_40 < 0)) {
        iVar7 = 0;
        while( true ) {
          apcStack_118[1] = (char *)0x13051a;
          iVar5 = fy_parse_peek_at(fyp,iVar7);
          if ((iVar5 < 0) || (iVar5 == 0x3a)) break;
          apcStack_118[1] = (char *)0x130532;
          _Var4 = fyp_is_lb(fyp,iVar5);
          if ((_Var4) || ((iVar5 != 0x20 && (iVar5 != 9)))) goto LAB_001305d3;
          iVar7 = iVar7 + 1;
        }
        if (iVar5 == 0x3a) {
          skm.required = true;
          skm._17_3_ = 0;
          skm.flow_level = 2;
          pfVar8 = fy_fill_atom_mark(fyp->current_input,(fy_mark *)local_90,(fy_mark *)local_80,
                                     (fy_atom *)local_148);
          fy_token_create(FYTT_INPUT_MARKER,pfVar8);
          pcVar13 = "invalid multiline plain key";
          goto LAB_00130211;
        }
      }
LAB_001305d3:
      apcStack_118[1] = (char *)0x1305e8;
      iVar7 = fy_save_simple_key_mark
                        (fyp,(fy_simple_key_mark *)local_108,FYTT_SCALAR,(fy_mark *)local_80);
      if (iVar7 != 0) {
        apcStack_118[1] = (char *)0x130616;
        fy_parser_diag(fyp,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                       ,0xd96,"fy_fetch_plain_scalar","fy_save_simple_key_mark() failed");
        return iVar7;
      }
      *(ushort *)&fyp->field_0x70 =
           (ushort)*(undefined4 *)&fyp->field_0x70 & 0xfff7 |
           (ushort)(byte)(((byte)local_a0 & 1) << 3);
      apcStack_118[0] = "true";
      if ((local_a0 & 1) == 0) {
        apcStack_118[0] = "false";
      }
      local_148._40_8_ = (fy_input *)0x13067b;
      fy_parser_diag(fyp,0x20,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                     ,0xd99,"fy_fetch_plain_scalar","simple_key_allowed -> %s\n");
      apcStack_118[1] = (char *)0x130688;
      iVar7 = fy_attach_comments_if_any(fyp,fyt);
      if (iVar7 == 0) {
        return 0;
      }
      pcVar13 = "fy_attach_right_hand_comment() failed";
      iVar7 = 0xd9d;
    }
    apcStack_118[1] = (char *)0x1306b7;
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,iVar7,"fy_fetch_plain_scalar",pcVar13);
  }
LAB_00130218:
  pcVar12[-8] = -1;
  pcVar12[-7] = -1;
  pcVar12[-6] = -1;
  pcVar12[-5] = -1;
  pcVar12[-4] = -1;
  pcVar12[-3] = -1;
  pcVar12[-2] = -1;
  pcVar12[-1] = -1;
  return (int)*(undefined8 *)(pcVar12 + -8);
}

Assistant:

int fy_fetch_plain_scalar(struct fy_parser *fyp, int c) {
    struct fy_atom handle;
    size_t length;
    int rc = -1, indent, run, nextc, i, breaks_found, blanks_found;
    bool has_leading_blanks, had_breaks;
    const char *last_ptr;
    struct fy_mark mark, last_mark;
    bool target_simple_key_allowed, is_multiline, is_complex, has_lb, has_ws;
    bool is_json_unesc, has_json_esc;
    struct fy_simple_key_mark skm;
    struct fy_token *fyt;
#ifdef ATOM_SIZE_CHECK
    size_t tlength;
#endif

    /* may not start with blankz */
    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !(fyp->state == FYPS_BLOCK_MAPPING_VALUE && fy_is_tab(c)), err_out,
                          "invalid tab as indendation in a mapping");

    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fyp_is_blankz(fyp, c), err_out,
                          "plain scalar cannot start with blank or zero");

    /* may not start with any of ,[]{}#&*!|>'\"%@` */
    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fy_utf8_strchr(",[]{}#&*!|>'\"%@`", c), err_out,
                          "plain scalar cannot start with '%c'", c);

    /* may not start with - not followed by blankz */
    FYP_PARSE_ERROR_CHECK(fyp, 0, 2, FYEM_SCAN,
                          c != '-' || !fy_is_blank_at_offset(fyp, 1), err_out,
                          "plain scalar cannot start with '%c' followed by blank", c);

    /* may not start with -?: not followed by blankz (in block context) */
    FYP_PARSE_ERROR_CHECK(fyp, 0, 2, FYEM_SCAN,
                          fyp->flow_level ||
                          !((c == '?' || c == ':') &&
                            fy_is_blank_at_offset(fyp, 1)), err_out,
                          "plain scalar cannot start with '%c' followed by blank (in block context)", c);

    /* check indentation */
    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fyp->flow_level || fyp->column > fyp->indent, err_out,
                          "wrongly indented flow %s",
                          fyp->flow == FYFT_SEQUENCE ? "sequence" : "mapping");

    fy_get_mark(fyp, &mark);
    target_simple_key_allowed = false;
    fy_get_simple_key_mark(fyp, &skm);

    fy_fill_atom_start(fyp, &handle);

    has_leading_blanks = false;
    had_breaks = false;
    has_lb = false;
    has_ws = false;
    has_json_esc = false;

    length = 0;
    breaks_found = 0;
    blanks_found = 0;
    indent = fyp->indent + 1;
    last_ptr = NULL;
    memset(&last_mark, 0, sizeof(last_mark));
    c = FYUG_EOF;
    for (;;) {
        /* break for document indicators */
        if (fyp->column == 0 &&
            (!fy_parse_strncmp(fyp, "---", 3) ||
             !fy_parse_strncmp(fyp, "...", 3)) &&
            fy_is_blankz_at_offset(fyp, 3))
            break;

        c = fy_parse_peek(fyp);
        if (c == '#')
            break;

        run = 0;
        for (;;) {
            if (fyp_is_blankz(fyp, c))
                break;

            nextc = fy_parse_peek_at(fyp, 1);

            /* ':' followed by space terminates */
            if (c == ':' && fyp_is_blankz(fyp, nextc))
                break;

            /* in flow context ':' followed by flow markers */
            if (fyp->flow_level && c == ':' && fy_utf8_strchr(",[]{}", nextc))
                break;

            /* in flow context any or , [ ] { } */
            if (fyp->flow_level && (c == ',' || c == '[' || c == ']' || c == '{' || c == '}'))
                break;

            if (breaks_found) {
                /* minimum 1 sep, or more for consecutive */
                length += breaks_found > 1 ? (breaks_found - 1) : 1;
                breaks_found = 0;
                blanks_found = 0;
            } else if (blanks_found) {
                /* just the blanks mam' */
                length += blanks_found;
                blanks_found = 0;
            }

            /* check whether we have a JSON unescaped character */
            is_json_unesc = fy_is_json_unescaped(c);
            if (!is_json_unesc)
                has_json_esc = true;

            fy_advance(fyp, c);
            run++;

            length += fy_utf8_width(c);

            c = nextc;
        }

        /* save end mark if we processed more than one non-blank */
        if (run > 0) {
            /* fyp_scan_debug(fyp, "saving mark"); */
            last_ptr = fyp->current_ptr;
            fy_get_mark(fyp, &last_mark);
        }

        /* end? */
        if (!(fy_is_blank(c) || fyp_is_lb(fyp, c)))
            break;

        has_json_esc = true;

        /* consume blanks */
        breaks_found = 0;
        blanks_found = 0;
        do {
            fy_advance(fyp, c);

            if (!fyp->tabsize) {
                /* check for tab */
                FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                                      c != '\t' || !has_leading_blanks || fyp->column >= indent, err_out,
                                      "invalid tab used as indentation");
            }

            nextc = fy_parse_peek(fyp);

            /* if it's a break */
            if (fyp_is_lb(fyp, c)) {
                /* first break, turn on leading blanks */
                if (!has_leading_blanks)
                    has_leading_blanks = true;
                had_breaks = true;
                breaks_found++;
                blanks_found = 0;
                has_lb = true;
            } else {
                blanks_found++;
                has_ws = true;
            }

            c = nextc;

        } while (fy_is_blank(c) || fyp_is_lb(fyp, c));

        /* break out if indentation is less */
        if (!fyp->flow_level && fyp->column < indent)
            break;
    }

    /* end... */
    if (!last_ptr)
        fy_fill_atom_end(fyp, &handle);
    else
        fy_fill_atom_end_at(fyp, &handle, &last_mark);

    if (c == FYUG_INV || c == FYUG_PARTIAL) {
        FYP_MARK_ERROR(fyp, &handle.start_mark, &handle.end_mark, FYEM_SCAN,
                       "plain scalar is malformed UTF8");
        goto err_out;
    }

    is_multiline = handle.end_mark.line > handle.start_mark.line;
    is_complex = fyp->pending_complex_key_column >= 0;

    handle.style = FYAS_PLAIN;
    handle.chomp = FYAC_STRIP;
    handle.direct_output = !is_multiline && !has_json_esc && fy_atom_size(&handle) == length;
    handle.empty = false;
    handle.has_lb = has_lb;
    handle.has_ws = has_ws;
    handle.starts_with_ws = false;
    handle.starts_with_lb = false;
    handle.ends_with_ws = false;
    handle.ends_with_lb = false;
    handle.trailing_lb = false;
    handle.size0 = length == 0;
    handle.valid_anchor = false;
    handle.tabsize = fyp->tabsize;

#ifdef ATOM_SIZE_CHECK
    tlength = fy_atom_format_text_length(&handle);
    fyp_error_check(fyp,
                    tlength == length,
                    err_out, "storage hint calculation failed real %zu != hint %zu - '%s'",
                    tlength, length,
                    fy_utf8_format_text_a(fy_atom_data(&handle), fy_atom_size(&handle), fyue_singlequote));
#endif

    handle.storage_hint = length;
    handle.storage_hint_valid = true;

    /* extra check in json mode */
    if (fyp_json_mode(fyp)) {
        FYP_MARK_ERROR_CHECK(fyp, &handle.start_mark, &handle.end_mark, FYEM_SCAN,
                             !is_multiline, err_out,
                             "Multi line plain scalars not supported in JSON mode");

        FYP_MARK_ERROR_CHECK(fyp, &handle.start_mark, &handle.end_mark, FYEM_SCAN,
                             !fy_atom_strcmp(&handle, "false") ||
                             !fy_atom_strcmp(&handle, "true") ||
                             !fy_atom_strcmp(&handle, "null") ||
                             fy_atom_is_number(&handle), err_out,
                             "Invalid JSON plain scalar");
    }

    /* and we're done */
    fyt = fy_token_queue(fyp, FYTT_SCALAR, &handle, FYSS_PLAIN);
    fyp_error_check(fyp, fyt, err_out_rc,
                    "fy_token_queue() failed");

    if (is_multiline && !fyp->flow_level && !is_complex) {
        /* due to the weirdness with simple keys scan forward
		* until a linebreak, ';', or anything else */
        for (i = 0;; i++) {
            c = fy_parse_peek_at(fyp, i);
            if (c < 0 || c == ':' || fyp_is_lb(fyp, c) || !fy_is_ws(c))
                break;
        }

        /* if we're a key, that's invalid */
        if (c == ':') {
            FYP_MARK_ERROR(fyp, &handle.start_mark, &handle.end_mark, FYEM_SCAN,
                           "invalid multiline plain key");
            goto err_out;
        }
    }

    target_simple_key_allowed = had_breaks;

    rc = fy_save_simple_key_mark(fyp, &skm, FYTT_SCALAR, &handle.end_mark);
    fyp_error_check(fyp, !rc, err_out_rc,
                    "fy_save_simple_key_mark() failed");

    fyp->simple_key_allowed = target_simple_key_allowed;
    fyp_scan_debug(fyp, "simple_key_allowed -> %s\n", fyp->simple_key_allowed ? "true" : "false");

    rc = fy_attach_comments_if_any(fyp, fyt);
    fyp_error_check(fyp, !rc, err_out_rc,
                    "fy_attach_right_hand_comment() failed");

    return 0;

    err_out:
    rc = -1;
    err_out_rc:
    return rc;
}